

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

int Cec_ManSimClassRemoveOne(Cec_ManSim_t *p,int i)

{
  int iVar1;
  int local_24;
  int local_20;
  int Ent;
  int iRepr;
  int i_local;
  Cec_ManSim_t *p_local;
  
  iVar1 = Gia_ObjIsConst(p->pAig,i);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsClass(p->pAig,i);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = Gia_ObjIsClass(p->pAig,i);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsClass(p->pAig, i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x13e,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
      }
      local_20 = Gia_ObjRepr(p->pAig,i);
      if (local_20 == 0xfffffff) {
        local_20 = i;
      }
      Vec_IntClear(p->vClassOld);
      Vec_IntClear(p->vClassNew);
      iVar1 = Gia_ObjIsHead(p->pAig,local_20);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsHead(p->pAig, iRepr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x145,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
      }
      for (local_24 = local_20; local_24 != 0; local_24 = Gia_ObjNext(p->pAig,local_24)) {
        if (local_24 == i) {
          Vec_IntPush(p->vClassNew,local_24);
        }
        else {
          Vec_IntPush(p->vClassOld,local_24);
        }
      }
      iVar1 = Vec_IntSize(p->vClassNew);
      if (iVar1 != 1) {
        __assert_fail("Vec_IntSize( p->vClassNew ) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x14c,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
      }
      Cec_ManSimClassCreate(p->pAig,p->vClassOld);
      Cec_ManSimClassCreate(p->pAig,p->vClassNew);
      iVar1 = Gia_ObjIsClass(p->pAig,i);
      if (iVar1 != 0) {
        __assert_fail("!Gia_ObjIsClass(p->pAig, i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x14f,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
      }
      p_local._4_4_ = 1;
    }
  }
  else {
    Gia_ObjSetRepr(p->pAig,i,0xfffffff);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Cec_ManSimClassRemoveOne( Cec_ManSim_t * p, int i )
{
    int iRepr, Ent;
    if ( Gia_ObjIsConst(p->pAig, i) )
    {
        Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        return 1;
    }
    if ( !Gia_ObjIsClass(p->pAig, i) )
        return 0;
    assert( Gia_ObjIsClass(p->pAig, i) );
    iRepr = Gia_ObjRepr( p->pAig, i );
    if ( iRepr == GIA_VOID )
        iRepr = i;
    // collect nodes
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Gia_ClassForEachObj( p->pAig, iRepr, Ent )
    {
        if ( Ent == i )
            Vec_IntPush( p->vClassNew, Ent );
        else
            Vec_IntPush( p->vClassOld, Ent );
    }
    assert( Vec_IntSize( p->vClassNew ) == 1 );
    Cec_ManSimClassCreate( p->pAig, p->vClassOld );
    Cec_ManSimClassCreate( p->pAig, p->vClassNew );
    assert( !Gia_ObjIsClass(p->pAig, i) );
    return 1;
}